

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::closeInterface(FederateState *this,InterfaceHandle handle,InterfaceType type)

{
  bool bVar1;
  iterator this_00;
  iterator msg;
  reference pGVar2;
  char in_DL;
  long in_RDI;
  GlobalHandle *pub_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range4_1;
  ActionMessage rem_1;
  InputInfo *ipt;
  EndpointInfo *ept;
  SubscriberInformation *sub;
  iterator __end4;
  iterator __begin4;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *__range4;
  ActionMessage rem;
  PublicationInfo *pub;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
  *in_stack_fffffffffffffdb8;
  ActionMessage *pAVar3;
  ActionMessage *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffde0;
  InterfaceInfo *in_stack_fffffffffffffde8;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  in_stack_fffffffffffffdf0;
  InterfaceHandle handle_00;
  ActionMessage local_1f8;
  InputInfo *local_138;
  EndpointInfo *local_128;
  GlobalHandle local_120;
  reference local_118;
  SubscriberInformation *local_110;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  local_108;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *local_100;
  GlobalHandle local_e8;
  ActionMessage local_e0;
  PublicationInfo *local_20;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  handle_00.hid = (BaseType)((ulong)in_stack_fffffffffffffdf0._M_current >> 0x20);
  if (in_DL == 'e') {
    local_128 = InterfaceInfo::getEndpoint(in_stack_fffffffffffffde8,handle_00);
    if (local_128 != (EndpointInfo *)0x0) {
      EndpointInfo::clearQueue((EndpointInfo *)in_stack_fffffffffffffde8);
    }
  }
  else if (in_DL == 'i') {
    local_138 = InterfaceInfo::getInput(in_stack_fffffffffffffde8,handle_00);
    if (local_138 != (InputInfo *)0x0) {
      pAVar3 = &local_1f8;
      ActionMessage::ActionMessage(in_stack_fffffffffffffde0,startingAction);
      ActionMessage::setSource(pAVar3,local_138->id);
      local_1f8.actionTime.internalTimeCode = *(baseType *)(in_RDI + 0x508);
      this_00 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                          ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                           pAVar3);
      msg = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                      ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)pAVar3
                      );
      while (bVar1 = __gnu_cxx::
                     operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                               ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 *)in_stack_fffffffffffffdc0,
                                (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 *)pAVar3), ((bVar1 ^ 0xffU) & 1) != 0) {
        pGVar2 = __gnu_cxx::
                 __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                 ::operator*((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                              *)&stack0xfffffffffffffdf0);
        ActionMessage::setDestination(&local_1f8,*pGVar2);
        routeMessage((FederateState *)this_00._M_current,(ActionMessage *)msg._M_current);
        __gnu_cxx::
        __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
        ::operator++((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                      *)&stack0xfffffffffffffdf0);
      }
      std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x4bffb5);
      InputInfo::clearFutureData((InputInfo *)CONCAT17(in_DL,in_stack_fffffffffffffdd0));
      ActionMessage::~ActionMessage(in_stack_fffffffffffffdc0);
    }
  }
  else if ((in_DL == 'p') &&
          (local_20 = InterfaceInfo::getPublication(in_stack_fffffffffffffde8,handle_00),
          local_20 != (PublicationInfo *)0x0)) {
    pAVar3 = &local_e0;
    ActionMessage::ActionMessage(in_stack_fffffffffffffde0,startingAction);
    local_e8 = local_20->id;
    ActionMessage::setSource(pAVar3,local_e8);
    local_e0.actionTime.internalTimeCode = *(baseType *)(in_RDI + 0x508);
    local_100 = &local_20->subscribers;
    local_108._M_current =
         (SubscriberInformation *)
         std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
         ::begin(in_stack_fffffffffffffdb8);
    local_110 = (SubscriberInformation *)
                std::
                vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                ::end(in_stack_fffffffffffffdb8);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                             ((__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                               *)pAVar3,
                              (__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                               *)in_stack_fffffffffffffdb8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_118 = __gnu_cxx::
                  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                  ::operator*(&local_108);
      local_120 = local_118->id;
      ActionMessage::setDestination(&local_e0,local_120);
      routeMessage((FederateState *)in_stack_fffffffffffffdf0._M_current,
                   (ActionMessage *)in_stack_fffffffffffffde8);
      __gnu_cxx::
      __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
      ::operator++(&local_108);
    }
    std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
    clear((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *)
          0x4bfe15);
    ActionMessage::~ActionMessage(pAVar3);
  }
  return;
}

Assistant:

void FederateState::closeInterface(InterfaceHandle handle, InterfaceType type)
{
    switch (type) {
        case InterfaceType::PUBLICATION: {
            auto* pub = interfaceInformation.getPublication(handle);
            if (pub != nullptr) {
                ActionMessage rem(CMD_REMOVE_PUBLICATION);
                rem.setSource(pub->id);
                rem.actionTime = time_granted;
                for (const auto& sub : pub->subscribers) {
                    rem.setDestination(sub.id);
                    routeMessage(rem);
                }
                pub->subscribers.clear();
            }
        } break;
        case InterfaceType::ENDPOINT: {
            auto* ept = interfaceInformation.getEndpoint(handle);
            if (ept != nullptr) {
                ept->clearQueue();
            }
        } break;
        case InterfaceType::INPUT: {
            auto* ipt = interfaceInformation.getInput(handle);
            if (ipt != nullptr) {
                ActionMessage rem(CMD_REMOVE_SUBSCRIBER);
                rem.setSource(ipt->id);
                rem.actionTime = time_granted;
                for (auto& pub : ipt->input_sources) {
                    rem.setDestination(pub);
                    routeMessage(rem);
                }
                ipt->input_sources.clear();
                ipt->clearFutureData();
            }
        } break;
        default:
            break;
    }
}